

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O0

int __thiscall primesieve::PrimeGenerator::init(PrimeGenerator *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  int extraout_EAX;
  const_iterator __position;
  uint64_t uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  unsigned_long *__first;
  size_t b;
  size_t a;
  size_t size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  PrimeGenerator *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffc8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  uint64_t in_stack_ffffffffffffffd8;
  
  __position._M_current =
       (unsigned_long *)
       anon_unknown.dwarf_f68d2::primeCountApprox
                 (in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  uVar1 = (this->super_Erat).start_;
  uVar2 = maxCachedPrime();
  if (uVar1 <= uVar2) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              getStartIdx(in_stack_ffffffffffffffa0);
    __first = (unsigned_long *)getStopIdx(this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)ctx,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)in_stack_ffffffffffffff98);
    std::array<unsigned_long,_128UL>::begin((array<unsigned_long,_128UL> *)0x153b0d);
    std::array<unsigned_long,_128UL>::begin((array<unsigned_long,_128UL> *)0x153b2a);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::insert<unsigned_long_const*,void>
              (this_00,__position,__first,(unsigned_long *)in_stack_ffffffffffffffd0);
  }
  initErat(this);
  return extraout_EAX;
}

Assistant:

void PrimeGenerator::init(vector<uint64_t>& primes)
{
  size_t size = primeCountApprox(start_, stop_);
  primes.reserve(size);

  if (start_ <= maxCachedPrime())
  {
    size_t a = getStartIdx();
    size_t b = getStopIdx();

    primes.insert(primes.end(),
             smallPrimes.begin() + a,
             smallPrimes.begin() + b);
  }

  initErat();
}